

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_image_section_cache.c
# Opt level: O0

int pt_iscache_lock(pt_image_section_cache *iscache)

{
  int iVar1;
  int errcode;
  pt_image_section_cache *iscache_local;
  
  if (iscache == (pt_image_section_cache *)0x0) {
    iscache_local._4_4_ = -1;
  }
  else {
    iVar1 = mtx_lock(&iscache->lock);
    if (iVar1 == 0) {
      iscache_local._4_4_ = 0;
    }
    else {
      iscache_local._4_4_ = -0x12;
    }
  }
  return iscache_local._4_4_;
}

Assistant:

static inline int pt_iscache_lock(struct pt_image_section_cache *iscache)
{
	if (!iscache)
		return -pte_internal;

#if defined(FEATURE_THREADS)
	{
		int errcode;

		errcode = mtx_lock(&iscache->lock);
		if (errcode != thrd_success)
			return -pte_bad_lock;
	}
#endif /* defined(FEATURE_THREADS) */

	return 0;
}